

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O0

void __thiscall
c4::yml::
Emitter<c4::yml::WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::_write_doc(Emitter<c4::yml::WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *this,size_t id)

{
  csubstr sp;
  csubstr tag;
  Location loc;
  Location loc_00;
  Location loc_01;
  Location loc_02;
  bool bVar1;
  error_flags eVar2;
  NodeData *pNVar3;
  NodeScalar *pNVar4;
  Tree *in_RDI;
  Tree *in_stack_fffffffffffffde8;
  char c;
  Tree *in_stack_fffffffffffffdf0;
  WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_fffffffffffffdf8;
  Location *in_stack_fffffffffffffe00;
  char *in_stack_fffffffffffffe08;
  size_t in_stack_fffffffffffffe10;
  size_t in_stack_fffffffffffffe38;
  undefined7 in_stack_fffffffffffffe40;
  undefined1 in_stack_fffffffffffffe47;
  undefined1 uVar5;
  Tree *in_stack_fffffffffffffe48;
  Tree *in_stack_fffffffffffffe58;
  Tree *in_stack_fffffffffffffe60;
  undefined8 in_stack_fffffffffffffe68;
  size_t in_stack_fffffffffffffe70;
  Tree *local_180;
  Tree *pTStack_178;
  WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_170;
  Location *pLStack_168;
  Tree *local_138;
  Tree *pTStack_130;
  WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_128;
  Location *pLStack_120;
  char *local_118;
  Tree *local_110;
  Tree *pTStack_108;
  WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_100;
  Location *pLStack_f8;
  char *local_f0;
  undefined1 local_a0 [8];
  size_t local_98;
  NodeData *local_80;
  size_t local_70;
  size_t local_60;
  NodeData *local_58;
  NodeData *local_50;
  NodeData *local_48;
  size_t local_38;
  size_t local_28;
  NodeData *local_20;
  NodeData *local_18;
  void *local_10;
  undefined1 *local_8;
  
  local_48 = Tree::_p((Tree *)CONCAT17(in_stack_fffffffffffffe47,in_stack_fffffffffffffe40),
                      in_stack_fffffffffffffe38);
  if (((local_48->m_type).type & DOC) == NOTYPE) {
    eVar2 = get_error_flags();
    if (((eVar2 & 1) != 0) && (bVar1 = is_debugger_attached(), bVar1)) {
      trap_instruction();
    }
    Location::Location(in_stack_fffffffffffffe00,(char *)in_stack_fffffffffffffdf8,
                       (size_t)in_stack_fffffffffffffdf0,(size_t)in_stack_fffffffffffffde8);
    loc.super_LineCol.line = (size_t)in_stack_fffffffffffffe58;
    loc.super_LineCol.offset = (size_t)in_RDI;
    loc.super_LineCol.col = (size_t)in_stack_fffffffffffffe60;
    loc.name.str = (char *)in_stack_fffffffffffffe68;
    loc.name.len = in_stack_fffffffffffffe70;
    error<33ul>((char (*) [33])CONCAT17(in_stack_fffffffffffffe47,in_stack_fffffffffffffe40),loc);
    in_stack_fffffffffffffde8 = local_110;
    in_stack_fffffffffffffdf0 = pTStack_108;
    in_stack_fffffffffffffdf8 = local_100;
    in_stack_fffffffffffffe00 = pLStack_f8;
    in_stack_fffffffffffffe08 = local_f0;
  }
  bVar1 = Tree::is_root((Tree *)CONCAT17(in_stack_fffffffffffffe47,in_stack_fffffffffffffe40),
                        in_stack_fffffffffffffe38);
  if (!bVar1) {
    in_stack_fffffffffffffe48 = (Tree *)in_RDI->m_size;
    Tree::parent(in_stack_fffffffffffffdf0,(size_t)in_stack_fffffffffffffde8);
    pNVar3 = Tree::_p((Tree *)CONCAT17(in_stack_fffffffffffffe47,in_stack_fffffffffffffe40),
                      in_stack_fffffffffffffe38);
    if (((pNVar3->m_type).type & STREAM) != STREAM) {
      eVar2 = get_error_flags();
      if (((eVar2 & 1) != 0) && (bVar1 = is_debugger_attached(), bVar1)) {
        trap_instruction();
      }
      Location::Location(in_stack_fffffffffffffe00,(char *)in_stack_fffffffffffffdf8,
                         (size_t)in_stack_fffffffffffffdf0,(size_t)in_stack_fffffffffffffde8);
      loc_00.super_LineCol.line = (size_t)in_stack_fffffffffffffe58;
      loc_00.super_LineCol.offset = (size_t)in_RDI;
      loc_00.super_LineCol.col = (size_t)in_stack_fffffffffffffe60;
      loc_00.name.str = (char *)in_stack_fffffffffffffe68;
      loc_00.name.len = in_stack_fffffffffffffe70;
      error<52ul>((char (*) [52])CONCAT17(in_stack_fffffffffffffe47,in_stack_fffffffffffffe40),
                  loc_00);
      in_stack_fffffffffffffde8 = local_138;
      in_stack_fffffffffffffdf0 = pTStack_130;
      in_stack_fffffffffffffdf8 = local_128;
      in_stack_fffffffffffffe00 = pLStack_120;
      in_stack_fffffffffffffe08 = local_118;
    }
    WriterOStream<std::__cxx11::stringstream>::_do_write<4ul>
              ((WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)in_stack_fffffffffffffdf0,(char (*) [4])in_stack_fffffffffffffde8);
  }
  local_28 = in_RDI->m_size;
  local_20 = Tree::_p((Tree *)CONCAT17(in_stack_fffffffffffffe47,in_stack_fffffffffffffe40),
                      in_stack_fffffffffffffe38);
  if (((local_20->m_type).type & VAL) == NOTYPE) {
    local_70 = in_RDI->m_size;
    pNVar3 = Tree::_p((Tree *)CONCAT17(in_stack_fffffffffffffe47,in_stack_fffffffffffffe40),
                      in_stack_fffffffffffffe38);
    c = (char)((ulong)in_stack_fffffffffffffde8 >> 0x38);
    uVar5 = false;
    if (((pNVar3->m_type).type & VALTAG) != NOTYPE) {
      uVar5 = ((pNVar3->m_type).type & (SEQ|MAP|VAL)) != NOTYPE;
    }
    local_58 = pNVar3;
    if ((bool)uVar5 != false) {
      bVar1 = Tree::is_root((Tree *)CONCAT17(uVar5,in_stack_fffffffffffffe40),(size_t)pNVar3);
      if (!bVar1) {
        WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::_do_write((WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)in_stack_fffffffffffffdf0,c);
      }
      Tree::val_tag(in_stack_fffffffffffffe58,(size_t)in_RDI);
      tag.len = in_stack_fffffffffffffe10;
      tag.str = in_stack_fffffffffffffe08;
      _write_tag((Emitter<c4::yml::WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)in_stack_fffffffffffffe00,tag);
    }
    local_60 = in_RDI->m_size;
    local_50 = Tree::_p((Tree *)CONCAT17(uVar5,in_stack_fffffffffffffe40),(size_t)pNVar3);
    bVar1 = false;
    if (((local_50->m_type).type & VALANCH) != NOTYPE) {
      bVar1 = ((local_50->m_type).type & (SEQ|MAP|VAL)) != NOTYPE;
    }
    if (bVar1) {
      bVar1 = Tree::is_root((Tree *)CONCAT17(uVar5,in_stack_fffffffffffffe40),(size_t)pNVar3);
      if (!bVar1) {
        WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::_do_write((WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)in_stack_fffffffffffffdf0,c);
      }
      WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::_do_write((WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)in_stack_fffffffffffffdf0,c);
      Tree::val_anchor(in_RDI,(size_t)in_stack_fffffffffffffe48);
      sp.len = (size_t)in_stack_fffffffffffffe08;
      sp.str = (char *)in_stack_fffffffffffffe00;
      WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::_do_write(in_stack_fffffffffffffdf8,sp);
    }
  }
  else {
    local_38 = in_RDI->m_size;
    local_18 = Tree::_p((Tree *)CONCAT17(in_stack_fffffffffffffe47,in_stack_fffffffffffffe40),
                        in_stack_fffffffffffffe38);
    if (((local_18->m_type).type & VAL) == NOTYPE) {
      eVar2 = get_error_flags();
      if (((eVar2 & 1) != 0) && (bVar1 = is_debugger_attached(), bVar1)) {
        trap_instruction();
      }
      Location::Location(in_stack_fffffffffffffe00,(char *)in_stack_fffffffffffffdf8,
                         (size_t)in_stack_fffffffffffffdf0,(size_t)in_stack_fffffffffffffde8);
      loc_01.super_LineCol.line = (size_t)in_stack_fffffffffffffe58;
      loc_01.super_LineCol.offset = (size_t)in_RDI;
      loc_01.super_LineCol.col = (size_t)in_stack_fffffffffffffe60;
      loc_01.name.str = (char *)in_stack_fffffffffffffe68;
      loc_01.name.len = in_stack_fffffffffffffe70;
      error<34ul>((char (*) [34])CONCAT17(in_stack_fffffffffffffe47,in_stack_fffffffffffffe40),
                  loc_01);
      in_stack_fffffffffffffde8 = local_180;
      in_stack_fffffffffffffdf0 = pTStack_178;
      in_stack_fffffffffffffdf8 = local_170;
      in_stack_fffffffffffffe00 = pLStack_168;
    }
    local_80 = Tree::_p((Tree *)CONCAT17(in_stack_fffffffffffffe47,in_stack_fffffffffffffe40),
                        in_stack_fffffffffffffe38);
    if (((local_80->m_type).type & KEY) != NOTYPE) {
      eVar2 = get_error_flags();
      if (((eVar2 & 1) != 0) && (bVar1 = is_debugger_attached(), bVar1)) {
        trap_instruction();
      }
      Location::Location(in_stack_fffffffffffffe00,(char *)in_stack_fffffffffffffdf8,
                         (size_t)in_stack_fffffffffffffdf0,(size_t)in_stack_fffffffffffffde8);
      in_stack_fffffffffffffdf0 = in_stack_fffffffffffffe60;
      in_stack_fffffffffffffde8 = in_stack_fffffffffffffe58;
      loc_02.super_LineCol.line = (size_t)in_stack_fffffffffffffde8;
      loc_02.super_LineCol.offset = (size_t)in_RDI;
      loc_02.super_LineCol.col = (size_t)in_stack_fffffffffffffdf0;
      loc_02.name.str = (char *)in_stack_fffffffffffffe68;
      loc_02.name.len = in_stack_fffffffffffffe70;
      error<35ul>((char (*) [35])CONCAT17(in_stack_fffffffffffffe47,in_stack_fffffffffffffe40),
                  loc_02);
    }
    c = (char)((ulong)in_stack_fffffffffffffde8 >> 0x38);
    bVar1 = Tree::is_root((Tree *)CONCAT17(in_stack_fffffffffffffe47,in_stack_fffffffffffffe40),
                          in_stack_fffffffffffffe38);
    if (!bVar1) {
      WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::_do_write((WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)in_stack_fffffffffffffdf0,c);
    }
    local_98 = 0;
    pNVar4 = Tree::valsc(in_stack_fffffffffffffe48,
                         CONCAT17(in_stack_fffffffffffffe47,in_stack_fffffffffffffe40));
    pNVar3 = Tree::_p((Tree *)CONCAT17(in_stack_fffffffffffffe47,in_stack_fffffffffffffe40),
                      in_stack_fffffffffffffe38);
    local_10 = (void *)((pNVar3->m_type).type & (_WIP_VAL_STYLE|VALQUO|VALANCH|VALREF|VAL));
    local_8 = local_a0;
    _write((Emitter<c4::yml::WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_RDI,(int)pNVar4,local_10,local_98);
  }
  WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::_do_write((WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)in_stack_fffffffffffffdf0,c);
  return;
}

Assistant:

void Emitter<Writer>::_write_doc(size_t id)
{
    RYML_ASSERT(m_tree->is_doc(id));
    if(!m_tree->is_root(id))
    {
        RYML_ASSERT(m_tree->is_stream(m_tree->parent(id)));
        this->Writer::_do_write("---");
    }
    if(!m_tree->has_val(id)) // this is more frequent
    {
        if(m_tree->has_val_tag(id))
        {
            if(!m_tree->is_root(id))
                this->Writer::_do_write(' ');
            _write_tag(m_tree->val_tag(id));
        }
        if(m_tree->has_val_anchor(id))
        {
            if(!m_tree->is_root(id))
                this->Writer::_do_write(' ');
            this->Writer::_do_write('&');
            this->Writer::_do_write(m_tree->val_anchor(id));
        }
    }
    else // docval
    {
        RYML_ASSERT(m_tree->has_val(id));
        RYML_ASSERT(!m_tree->has_key(id));
        if(!m_tree->is_root(id))
            this->Writer::_do_write(' ');
        _writev(id, 0);
    }
    this->Writer::_do_write('\n');
}